

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSharedData::SetCircleSegmentMaxError(ImDrawListSharedData *this,float max_error)

{
  int iVar1;
  long in_RDI;
  float in_XMM0_Da;
  float fVar2;
  int segment_count;
  float radius;
  int i;
  undefined4 local_10;
  
  if ((*(float *)(in_RDI + 0x18) != in_XMM0_Da) ||
     (NAN(*(float *)(in_RDI + 0x18)) || NAN(in_XMM0_Da))) {
    *(float *)(in_RDI + 0x18) = in_XMM0_Da;
    for (local_10 = 0; local_10 < 0x40; local_10 = local_10 + 1) {
      fVar2 = acosf((((float)local_10 + 1.0) - *(float *)(in_RDI + 0x18)) / ((float)local_10 + 1.0))
      ;
      iVar1 = ImClamp<int>((int)(6.2831855 / fVar2),0xc,0x200);
      iVar1 = ImMin<int>(iVar1,0xff);
      *(char *)(in_RDI + 0x90 + (long)local_10) = (char)iVar1;
    }
  }
  return;
}

Assistant:

void ImDrawListSharedData::SetCircleSegmentMaxError(float max_error)
{
    if (CircleSegmentMaxError == max_error)
        return;
    CircleSegmentMaxError = max_error;
    for (int i = 0; i < IM_ARRAYSIZE(CircleSegmentCounts); i++)
    {
        const float radius = i + 1.0f;
        const int segment_count = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, CircleSegmentMaxError);
        CircleSegmentCounts[i] = (ImU8)ImMin(segment_count, 255);
    }
}